

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdfdrivr.c
# Opt level: O3

FT_UInt bdf_cmap_char_next(FT_CMap bdfcmap,FT_UInt32 *acharcode)

{
  FT_Face pFVar1;
  long lVar2;
  ulong uVar3;
  FT_UInt32 FVar4;
  FT_Face pFVar5;
  uint uVar6;
  FT_Face pFVar7;
  FT_Face pFVar8;
  
  pFVar1 = bdfcmap[1].charmap.face;
  lVar2 = *(long *)&bdfcmap[1].charmap.encoding;
  if (pFVar1 == (FT_Face)0x0) {
    pFVar5 = (FT_Face)0x0;
  }
  else {
    FVar4 = *acharcode + 1;
    pFVar5 = (FT_Face)0x0;
    pFVar7 = pFVar1;
    do {
      pFVar8 = (FT_Face)((ulong)((long)&pFVar7->num_faces + (long)&pFVar5->num_faces) >> 1);
      uVar3 = *(ulong *)(lVar2 + (long)pFVar8 * 0x10);
      if (uVar3 == FVar4) {
        uVar6 = *(int *)(lVar2 + (long)pFVar8 * 0x10 + 8) + 1;
        goto LAB_0013e1f3;
      }
      if (uVar3 <= FVar4) {
        pFVar5 = (FT_Face)((long)&pFVar8->num_faces + 1);
        pFVar8 = pFVar7;
      }
      pFVar7 = pFVar8;
    } while (pFVar5 < pFVar8);
  }
  uVar6 = 0;
  FVar4 = 0;
  if (pFVar5 < pFVar1) {
    uVar3 = *(ulong *)(lVar2 + (long)pFVar5 * 0x10);
    uVar6 = *(int *)(lVar2 + 8 + (long)pFVar5 * 0x10) + 1;
    FVar4 = 0;
    if (uVar3 >> 0x20 == 0) {
      FVar4 = (FT_UInt32)uVar3;
    }
  }
LAB_0013e1f3:
  *acharcode = FVar4;
  return uVar6 & 0xffff;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt )
  bdf_cmap_char_next( FT_CMap     bdfcmap,
                      FT_UInt32  *acharcode )
  {
    BDF_CMap          cmap      = (BDF_CMap)bdfcmap;
    BDF_encoding_el*  encodings = cmap->encodings;
    FT_ULong          min, max, mid; /* num_encodings */
    FT_UShort         result   = 0;  /* encodings->glyph */
    FT_ULong          charcode = *acharcode + 1;


    min = 0;
    max = cmap->num_encodings;

    while ( min < max )
    {
      FT_ULong  code; /* same as BDF_encoding_el.enc */


      mid  = ( min + max ) >> 1;
      code = (FT_ULong)encodings[mid].enc;

      if ( charcode == code )
      {
        /* increase glyph index by 1 --              */
        /* we reserve slot 0 for the undefined glyph */
        result = encodings[mid].glyph + 1;
        goto Exit;
      }

      if ( charcode < code )
        max = mid;
      else
        min = mid + 1;
    }

    charcode = 0;
    if ( min < cmap->num_encodings )
    {
      charcode = (FT_ULong)encodings[min].enc;
      result   = encodings[min].glyph + 1;
    }

  Exit:
    if ( charcode > 0xFFFFFFFFUL )
    {
      FT_TRACE1(( "bdf_cmap_char_next: charcode 0x%x > 32bit API" ));
      *acharcode = 0;
      /* XXX: result should be changed to indicate an overflow error */
    }
    else
      *acharcode = (FT_UInt32)charcode;
    return result;
  }